

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_qcc_dumpparms(jpc_ms_t *ms,FILE *out)

{
  uint uVar1;
  ulong uVar2;
  
  fprintf((FILE *)out,"compno = %lu; qntsty = %d; numguard = %d; numstepsizes = %d\n",
          (ms->parms).sot.tileno,(ulong)(ms->parms).coc.compparms.csty,
          (ulong)(ms->parms).cod.compparms.cblksty,(ulong)*(uint *)((long)&ms->parms + 0xc));
  if (0 < *(int *)((long)&ms->parms + 0xc)) {
    uVar2 = 0;
    do {
      uVar1 = *(uint *)((ms->parms).ppm.data + uVar2 * 8);
      fprintf((FILE *)out,"expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",uVar2 & 0xffffffff,
              (ulong)(uVar1 >> 0xb),uVar2 & 0xffffffff,(ulong)(uVar1 & 0x7ff));
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)*(int *)((long)&ms->parms + 0xc));
  }
  return 0;
}

Assistant:

static int jpc_qcc_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_qcc_t *qcc = &ms->parms.qcc;
	int i;
	fprintf(out, "compno = %"PRIuFAST16"; qntsty = %d; numguard = %d; "
	  "numstepsizes = %d\n", qcc->compno, qcc->compparms.qntsty, qcc->compparms.numguard,
	  qcc->compparms.numstepsizes);
	for (i = 0; i < qcc->compparms.numstepsizes; ++i) {
		fprintf(out, "expn[%d] = 0x%04x; mant[%d] = 0x%04x;\n",
		  i, (unsigned) JPC_QCX_GETEXPN(qcc->compparms.stepsizes[i]),
		  i, (unsigned) JPC_QCX_GETMANT(qcc->compparms.stepsizes[i]));
	}
	return 0;
}